

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketServerTests::TestsocketServerFixtureblock::RunImpl(TestsocketServerFixtureblock *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_58 [8];
  socketServerFixtureblockHelper fixtureHelper;
  bool ctorOk;
  TestsocketServerFixtureblock *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  socketServerFixtureblockHelper::socketServerFixtureblockHelper
            ((socketServerFixtureblockHelper *)local_58,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSocketServerTests::socketServerFixtureblockHelper>
            ((socketServerFixtureblockHelper *)local_58,&(this->super_Test).m_details);
  socketServerFixtureblockHelper::~socketServerFixtureblockHelper
            ((socketServerFixtureblockHelper *)local_58);
  return;
}

Assistant:

TEST_FIXTURE(socketServerFixture, block)
{
  SocketServer object( 0 );
  object.add( TestSettings::port, true, true );
  socket_handle clientS = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS >= 0 );

  object.block( *this );
  CHECK_EQUAL( 1, connect );
  CHECK( connectSocket > 0 );

  send( clientS, "1", 1, 0 );
  object.block( *this );
  object.block( *this );
  CHECK_EQUAL( 1, data );
  CHECK_EQUAL( 1U, bufLen );
  CHECK_EQUAL( '1', *buf );
  CHECK( dataSocket > 0 );

  destroySocket( clientS );
  object.block( *this );
  CHECK_EQUAL( 1, disconnect );
  CHECK( disconnectSocket > 0 );
}